

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

EmulatorEvent host_run_until_ticks(Host *host,Ticks ticks)

{
  EmulatorEvent event_00;
  Emulator *e_00;
  Ticks TVar1;
  EmulatorEvent event;
  Emulator *e;
  Ticks ticks_local;
  Host *host_local;
  
  e_00 = host_get_emulator(host);
  TVar1 = emulator_get_ticks(e_00);
  if (ticks < TVar1) {
    __assert_fail("emulator_get_ticks(e) <= ticks",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                  0x169,"EmulatorEvent host_run_until_ticks(struct Host *, Ticks)");
  }
  do {
    event_00 = emulator_run_until(e_00,ticks);
    host_handle_event(host,event_00);
  } while ((event_00 & 0x1c) == 0);
  return event_00;
}

Assistant:

static EmulatorEvent host_run_until_ticks(struct Host* host, Ticks ticks) {
  Emulator* e = host_get_emulator(host);
  assert(emulator_get_ticks(e) <= ticks);
  EmulatorEvent event;
  do {
    event = emulator_run_until(e, ticks);
    host_handle_event(host, event);
  } while (!(event & (EMULATOR_EVENT_UNTIL_TICKS | EMULATOR_EVENT_BREAKPOINT |
                      EMULATOR_EVENT_INVALID_OPCODE)));
  return event;
}